

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *
upb::generator::SortedExtensions
          (vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__return_storage_ptr__,
          FileDefPtr file)

{
  int iVar1;
  int iVar2;
  MessageDefPtr message;
  int local_3c;
  FieldDefPtr FStack_38;
  int i_1;
  int local_30;
  int i;
  undefined1 local_19;
  FileDefPtr local_18;
  FileDefPtr file_local;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *ret;
  
  local_19 = 0;
  local_18.ptr_ = file.ptr_;
  file_local.ptr_ = (upb_FileDef *)__return_storage_ptr__;
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::vector(__return_storage_ptr__);
  iVar1 = FileDefPtr::toplevel_extension_count(&local_18);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            (__return_storage_ptr__,(long)iVar1);
  for (local_30 = 0; iVar1 = local_30, iVar2 = FileDefPtr::toplevel_extension_count(&local_18),
      iVar1 < iVar2; local_30 = local_30 + 1) {
    FStack_38 = FileDefPtr::toplevel_extension(&local_18,local_30);
    std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::push_back
              (__return_storage_ptr__,&stack0xffffffffffffffc8);
  }
  for (local_3c = 0; iVar1 = FileDefPtr::toplevel_message_count(&local_18), local_3c < iVar1;
      local_3c = local_3c + 1) {
    message = FileDefPtr::toplevel_message(&local_18,local_3c);
    AddExtensionsFromMessage(message,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::FieldDefPtr> SortedExtensions(upb::FileDefPtr file) {
  std::vector<upb::FieldDefPtr> ret;
  ret.reserve(file.toplevel_extension_count());
  for (int i = 0; i < file.toplevel_extension_count(); i++) {
    ret.push_back(file.toplevel_extension(i));
  }
  for (int i = 0; i < file.toplevel_message_count(); i++) {
    AddExtensionsFromMessage(file.toplevel_message(i), &ret);
  }
  return ret;
}